

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O0

c_float quad_form(csc *P,c_float *x)

{
  long lVar1;
  long in_RSI;
  long in_RDI;
  double dVar2;
  c_int ptr;
  c_int j;
  c_int i;
  c_float quad_form;
  long local_38;
  long local_30;
  c_float local_20;
  
  local_20 = 0.0;
  local_30 = 0;
  do {
    if (*(long *)(in_RDI + 0x10) <= local_30) {
      return local_20;
    }
    for (local_38 = *(long *)(*(long *)(in_RDI + 0x18) + local_30 * 8);
        local_38 < *(long *)(*(long *)(in_RDI + 0x18) + 8 + local_30 * 8); local_38 = local_38 + 1)
    {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x20) + local_38 * 8);
      if (lVar1 == local_30) {
        dVar2 = *(double *)(*(long *)(in_RDI + 0x28) + local_38 * 8) * 0.5 *
                *(double *)(in_RSI + lVar1 * 8) * *(double *)(in_RSI + lVar1 * 8);
      }
      else {
        if (local_30 <= lVar1) {
          printf("ERROR in %s: ","quad_form");
          printf("quad_form matrix is not upper triangular");
          printf("\n");
          return 0.0;
        }
        dVar2 = *(double *)(*(long *)(in_RDI + 0x28) + local_38 * 8) *
                *(double *)(in_RSI + lVar1 * 8) * *(double *)(in_RSI + local_30 * 8);
      }
      local_20 = dVar2 + local_20;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

c_float quad_form(const csc *P, const c_float *x) {
  c_float quad_form = 0.;
  c_int   i, j, ptr;                                // Pointers to iterate over
                                                    // matrix: (i,j) a element
                                                    // pointer

  for (j = 0; j < P->n; j++) {                      // Iterate over columns
    for (ptr = P->p[j]; ptr < P->p[j + 1]; ptr++) { // Iterate over rows
      i = P->i[ptr];                                // Row index

      if (i == j) {                                 // Diagonal element
        quad_form += (c_float).5 * P->x[ptr] * x[i] * x[i];
      }
      else if (i < j) {                             // Off-diagonal element
        quad_form += P->x[ptr] * x[i] * x[j];
      }
      else {                                        // Element in lower diagonal
                                                    // part
#ifdef PRINTING
        c_eprint("quad_form matrix is not upper triangular");
#endif /* ifdef PRINTING */
        return OSQP_NULL;
      }
    }
  }
  return quad_form;
}